

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O2

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetRefPattern
          (TPZIdentifyRefPattern *this,TPZGeoEl *father,TPZVec<TPZGeoEl_*> *subelem)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TPZRefPattern *this_00;
  TPZVec<TPZGeoEl_*> *in_RCX;
  TPZIdentifyRefPattern *pTVar4;
  TPZIdentifyRefPattern *this_01;
  TPZVec<TPZGeoEl_*> *this_02;
  TPZAutoPointer<TPZRefPattern> rp;
  allocator<char> local_79;
  undefined1 local_78 [8];
  TPZAutoPointer<TPZRefPattern> mesh_rp;
  TPZVec<TPZGeoEl_*> local_50;
  
  pTVar4 = (TPZIdentifyRefPattern *)&rp;
  this_01 = (TPZIdentifyRefPattern *)&rp;
  local_78 = (undefined1  [8])this;
  iVar2 = (*subelem->_vptr_TPZVec[0x17])(subelem);
  iVar1 = (int)in_RCX->fNElements;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&rp);
  if (iVar2 == 1) {
    if (iVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzidentifyrefpattern.cpp"
                 ,0x2e);
    }
    this_00 = (TPZRefPattern *)operator_new(0x360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mesh_rp,"/home/pos/cesar/RefPattern/Unif_Linear.rpt",&local_79);
    TPZRefPattern::TPZRefPattern(this_00,(string *)&mesh_rp);
    std::__cxx11::string::~string((string *)&mesh_rp);
    TPZAutoPointer<TPZRefPattern>::operator=(&rp,this_00);
  }
  else {
    this_01 = pTVar4;
    if (iVar2 == 0) {
      if (iVar1 != 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzidentifyrefpattern.cpp"
                   ,0x27);
      }
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)local_78,(TPZRefPattern *)0x0);
      goto LAB_0125ff63;
    }
  }
  iVar2 = UniformSubElem(this_01,iVar2);
  if (iVar2 == iVar1) {
    GetUniform((TPZIdentifyRefPattern *)&mesh_rp,father);
    TPZAutoPointer<TPZRefPattern>::operator=(&rp,&mesh_rp);
  }
  else {
    this_02 = &local_50;
    TPZVec<TPZGeoEl_*>::TPZVec(this_02,in_RCX);
    IdentifySide((TPZIdentifyRefPattern *)this_02,(TPZGeoEl *)subelem,&local_50);
    TPZVec<TPZGeoEl_*>::~TPZVec(&local_50);
    GetSideRefPattern((TPZIdentifyRefPattern *)&mesh_rp,father,(int)subelem);
    TPZAutoPointer<TPZRefPattern>::operator=(&rp,&mesh_rp);
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&mesh_rp);
  TPZRefPatternDataBase::FindRefPattern
            ((TPZRefPatternDataBase *)&mesh_rp,(TPZAutoPointer<TPZRefPattern> *)&gRefDBase);
  if ((mesh_rp.fRef == (TPZReference *)0x0) || ((mesh_rp.fRef)->fPointer == (TPZRefPattern *)0x0)) {
    TPZRefPatternDataBase::InsertRefPattern(&gRefDBase,&rp);
    *(TPZReference **)local_78 = rp.fRef;
    rp.fRef = (TPZReference *)0x0;
  }
  else {
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)local_78,(mesh_rp.fRef)->fPointer);
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&mesh_rp);
LAB_0125ff63:
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&rp);
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)local_78;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetRefPattern (TPZGeoEl *father, TPZVec<TPZGeoEl *> subelem){
	MElementType eltype =  father->Type();
	int nelem = subelem.NElements();
	TPZAutoPointer<TPZRefPattern> rp;
	switch (eltype) {
		case (EPoint) : {
			if (nelem != 1){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!" << endl;
				DebugStop();
			}
			return 0;// return refpattern for point!!
		}
		case (EOned) :{
			if (nelem != 2){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!" << endl;
				DebugStop();
			}
			TPZRefPattern * newRef = new TPZRefPattern ("/home/pos/cesar/RefPattern/Unif_Linear.rpt");
			rp = newRef;
		}
		default : {
			//return a uniform refinement pattern
			if (nelem == UniformSubElem(eltype)) {
				rp = GetUniform(father);
			} else {
				//identify the side refinement pattern
				int side = IdentifySide(father,subelem);
				rp = GetSideRefPattern(father,side);
			}
		}
	}
	TPZAutoPointer<TPZRefPattern> mesh_rp = gRefDBase.FindRefPattern(rp);
	//If the refinement pattern is already defined delete the created refinement pattern
	if (mesh_rp) {
		return mesh_rp.operator->();
	}
	//Insert a new refinement pattern into mesh
	gRefDBase.InsertRefPattern(rp);
	return rp;
}